

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchIRBuilder.cpp
# Opt level: O1

void __thiscall
SwitchIRBuilder::SetProfiledInstruction(SwitchIRBuilder *this,Instr *instr,ProfileId profileId)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  JITTimeFunctionBody *pJVar4;
  JITTimeProfileInfo *this_00;
  undefined4 *puVar5;
  FunctionJITTimeInfo *this_01;
  char16 *pcVar6;
  char local_178 [8];
  char valueTypeStr [256];
  char16 debugStringBuffer [42];
  ValueType valueType;
  
  this->m_profiledSwitchInstr = instr;
  this->m_switchOptBuildBail = true;
  if (instr->m_kind == InstrKindProfiled) {
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
    bVar3 = JITTimeFunctionBody::HasProfileInfo(pJVar4);
    if (!bVar3) {
      return;
    }
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_profiledSwitchInstr->m_func->m_workItem);
    this_00 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar4);
    debugStringBuffer[0x27] = (char16)JITTimeProfileInfo::GetSwitchProfileInfo(this_00,profileId);
    if (instr->m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar3) goto LAB_0062df67;
      *puVar5 = 0;
    }
    *(char16 *)&instr[1]._vptr_Instr = debugStringBuffer[0x27];
    bVar3 = ValueType::IsLikelyTaggedInt((ValueType *)(debugStringBuffer + 0x27));
    this->m_switchIntDynProfile = bVar3;
    bVar3 = ValueType::IsLikelyString((ValueType *)(debugStringBuffer + 0x27));
    this->m_switchStrDynProfile = bVar3;
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,SwitchOptPhase);
    if (bVar3) {
      ValueType::ToString((ValueType *)(debugStringBuffer + 0x27),(char (*) [256])local_178);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,SwitchOptPhase);
      if (bVar3) {
        this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_profiledSwitchInstr->m_func->m_workItem);
        pcVar6 = FunctionJITTimeInfo::GetDebugNumberSet
                           (this_01,(wchar (*) [42])(valueTypeStr + 0xf8));
        pIVar1 = this->m_profiledSwitchInstr;
        if (pIVar1->m_kind != InstrKindProfiled) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
          if (!bVar3) {
LAB_0062df67:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        Output::Print(L"Func %s, Switch %d: Expression Type : %S\n",pcVar6,
                      (ulong)*(uint *)&pIVar1[1]._vptr_Instr,local_178);
        Output::Flush();
      }
    }
  }
  return;
}

Assistant:

void
SwitchIRBuilder::SetProfiledInstruction(IR::Instr * instr, Js::ProfileId profileId)
{
    m_profiledSwitchInstr = instr;
    m_switchOptBuildBail = true;

    //don't optimize if the switch expression is not an Integer (obtained via dynamic profiling data of the BeginSwitch opcode)

    bool hasProfile = m_profiledSwitchInstr->IsProfiledInstr() && m_profiledSwitchInstr->m_func->HasProfileInfo();

    if (hasProfile)
    {
        const ValueType valueType(m_profiledSwitchInstr->m_func->GetReadOnlyProfileInfo()->GetSwitchProfileInfo(profileId));
        instr->AsProfiledInstr()->u.FldInfo().valueType = valueType;
        m_switchIntDynProfile = valueType.IsLikelyTaggedInt();
        m_switchStrDynProfile = valueType.IsLikelyString();

        if (PHASE_TESTTRACE1(Js::SwitchOptPhase))
        {
            char valueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            valueType.ToString(valueTypeStr);
#if ENABLE_DEBUG_CONFIG_OPTIONS
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
            PHASE_PRINT_TESTTRACE1(Js::SwitchOptPhase, _u("Func %s, Switch %d: Expression Type : %S\n"),
                m_profiledSwitchInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                m_profiledSwitchInstr->AsProfiledInstr()->u.profileId, valueTypeStr);
        }
    }
}